

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_Encode_Test::TestBody
          (EncodeDecodeTest_Encode_Test *this)

{
  bool bVar1;
  ParamType *pPVar2;
  char *message;
  AlphaNum *in_RCX;
  char *in_R9;
  string_view path;
  string local_1d8;
  AssertHelper local_1b8;
  Message local_1b0;
  AlphaNum local_1a8;
  AlphaNum local_178;
  string local_148;
  bool local_121;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_;
  string args;
  size_t local_e8;
  string local_e0;
  AlphaNum local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  AlphaNum local_60;
  undefined1 local_30 [8];
  string golden_path;
  EncodeDecodeTest_Encode_Test *this_local;
  
  golden_path.field_2._8_8_ = this;
  TestTempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_60,&local_80);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,"/golden_message");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_30,(lts_20250127 *)&local_60,&local_c0,in_RCX);
  std::__cxx11::string::~string((string *)&local_80);
  WriteGoldenMessage((string *)local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&args.field_2 + 8),
             "google/protobuf/testdata/text_format_unittest_data_oneof_implemented.txt");
  path._M_str = (char *)in_RCX;
  path._M_len = local_e8;
  TestUtil::GetTestDataPath_abi_cxx11_(&local_e0,(TestUtil *)args.field_2._8_8_,path);
  EncodeDecodeTest::RedirectStdinFromFile(&this->super_EncodeDecodeTest,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  pPVar2 = testing::
           WithParamInterface<google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTestMode>
           ::GetParam();
  if (*pPVar2 != DESCRIPTOR_SET_IN) {
    std::__cxx11::string::append((char *)&gtest_ar_.message_);
  }
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
            (&local_178,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_1a8," --encode=proto2_unittest.TestAllTypes");
  absl::lts_20250127::StrCat_abi_cxx11_(&local_148,(lts_20250127 *)&local_178,&local_1a8,in_RCX);
  local_121 = EncodeDecodeTest::Run(&this->super_EncodeDecodeTest,&local_148,true);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_120,&local_121,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,(internal *)local_120,
               (AssertionResult *)
               "Run(absl::StrCat(args, \" --encode=proto2_unittest.TestAllTypes\"))","false","true",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x11c7,message);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  EncodeDecodeTest::ExpectStdoutMatchesBinaryFile(&this->super_EncodeDecodeTest,(string *)local_30);
  EncodeDecodeTest::ExpectNoErrors(&this->super_EncodeDecodeTest);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, Encode) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(TestUtil::GetTestDataPath(
      "google/protobuf/"
      "testdata/text_format_unittest_data_oneof_implemented.txt"));
  std::string args;
  if (GetParam() != DESCRIPTOR_SET_IN) {
    args.append("google/protobuf/unittest.proto");
  }
  EXPECT_TRUE(
      Run(absl::StrCat(args, " --encode=proto2_unittest.TestAllTypes")));
  ExpectStdoutMatchesBinaryFile(golden_path);
  ExpectNoErrors();
}